

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O3

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<4,_9,_9>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int i;
  undefined8 *puVar1;
  float *pfVar2;
  long lVar3;
  undefined4 *puVar4;
  undefined8 *puVar5;
  long lVar6;
  int col_1;
  int col;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  bool bVar12;
  undefined4 uVar13;
  Matrix<float,_3,_3> retVal;
  float afStack_b8 [6];
  float local_a0 [2];
  ulong local_98;
  undefined4 local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  Vector<float,_3> res_1;
  Vector<float,_3> res;
  undefined8 uStack_58;
  Mat3 m_1;
  float local_28 [10];
  long lVar11;
  
  puVar1 = &uStack_58;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar3 = 0;
    lVar6 = 0;
    do {
      lVar7 = 0;
      auVar8 = _DAT_00a99400;
      do {
        bVar12 = SUB164(auVar8 ^ _DAT_00a99450,4) == -0x80000000 &&
                 SUB164(auVar8 ^ _DAT_00a99450,0) < -0x7ffffffd;
        if (bVar12) {
          uVar13 = 0x3f800000;
          if (lVar3 != lVar7) {
            uVar13 = 0;
          }
          *(undefined4 *)((long)puVar1 + lVar7) = uVar13;
        }
        if (bVar12) {
          uVar13 = 0x3f800000;
          if (lVar3 + -0xc != lVar7) {
            uVar13 = 0;
          }
          *(undefined4 *)((long)puVar1 + lVar7 + 0xc) = uVar13;
        }
        lVar11 = auVar8._8_8_;
        auVar8._0_8_ = auVar8._0_8_ + 2;
        auVar8._8_8_ = lVar11 + 2;
        lVar7 = lVar7 + 0x18;
      } while (lVar7 != 0x30);
      lVar6 = lVar6 + 1;
      lVar3 = lVar3 + 0xc;
      puVar1 = (undefined8 *)((long)puVar1 + 4);
    } while (lVar6 != 3);
    uStack_58 = *(undefined8 *)evalCtx->in[0].m_data;
    m_1.m_data.m_data[0].m_data[1] = evalCtx->in[1].m_data[0];
    m_1.m_data.m_data[0].m_data[0] = evalCtx->in[0].m_data[2];
    m_1.m_data.m_data._8_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 1);
    m_1.m_data.m_data[1].m_data._4_8_ = *(undefined8 *)evalCtx->in[2].m_data;
    m_1.m_data.m_data[2].m_data[0] = evalCtx->in[2].m_data[2];
  }
  else {
    m_1.m_data.m_data[0].m_data[2] = 0.0;
    m_1.m_data.m_data[1].m_data[0] = 0.0;
    m_1.m_data.m_data[1].m_data[1] = 0.0;
    m_1.m_data.m_data[1].m_data[2] = 0.0;
    uStack_58 = 0;
    m_1.m_data.m_data[0].m_data[0] = 0.0;
    m_1.m_data.m_data[0].m_data[1] = 0.0;
    m_1.m_data.m_data[2].m_data[0] = 0.0;
    puVar4 = &sr::(anonymous_namespace)::s_constInMat3x3;
    lVar3 = 0;
    do {
      lVar6 = 0;
      puVar5 = puVar1;
      do {
        *(undefined4 *)puVar5 = puVar4[lVar6];
        lVar6 = lVar6 + 1;
        puVar5 = (undefined8 *)((long)puVar5 + 0xc);
      } while (lVar6 != 3);
      lVar3 = lVar3 + 1;
      puVar1 = (undefined8 *)((long)puVar1 + 4);
      puVar4 = puVar4 + 3;
    } while (lVar3 != 3);
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    puVar1 = &local_88;
    lVar3 = 0;
    lVar6 = 0;
    do {
      lVar7 = 0;
      auVar9 = _DAT_00a99400;
      do {
        bVar12 = SUB164(auVar9 ^ _DAT_00a99450,4) == -0x80000000 &&
                 SUB164(auVar9 ^ _DAT_00a99450,0) < -0x7ffffffd;
        if (bVar12) {
          uVar13 = 0x3f800000;
          if (lVar3 != lVar7) {
            uVar13 = 0;
          }
          *(undefined4 *)((long)puVar1 + lVar7) = uVar13;
        }
        if (bVar12) {
          uVar13 = 0x3f800000;
          if (lVar3 + -0xc != lVar7) {
            uVar13 = 0;
          }
          *(undefined4 *)((long)puVar1 + lVar7 + 0xc) = uVar13;
        }
        lVar11 = auVar9._8_8_;
        auVar9._0_8_ = auVar9._0_8_ + 2;
        auVar9._8_8_ = lVar11 + 2;
        lVar7 = lVar7 + 0x18;
      } while (lVar7 != 0x30);
      lVar6 = lVar6 + 1;
      lVar3 = lVar3 + 0xc;
      puVar1 = (undefined8 *)((long)puVar1 + 4);
    } while (lVar6 != 3);
    local_88 = *(undefined8 *)evalCtx->in[0].m_data;
    uStack_80 = CONCAT44(evalCtx->in[1].m_data[0],evalCtx->in[0].m_data[2]);
    res_1.m_data._0_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 1);
    stack0xffffffffffffff90 = *(undefined8 *)evalCtx->in[2].m_data;
  }
  else {
    puVar1 = &local_88;
    res_1.m_data[0] = 0.0;
    res_1.m_data[1] = 0.0;
    stack0xffffffffffffff90 = 0;
    local_88 = 0;
    uStack_80 = 0;
    puVar4 = &DAT_00af0a94;
    lVar3 = 0;
    do {
      lVar6 = 0;
      puVar5 = puVar1;
      do {
        *(undefined4 *)puVar5 = puVar4[lVar6];
        lVar6 = lVar6 + 1;
        puVar5 = (undefined8 *)((long)puVar5 + 0xc);
      } while (lVar6 != 3);
      lVar3 = lVar3 + 1;
      puVar1 = (undefined8 *)((long)puVar1 + 4);
      puVar4 = puVar4 + 3;
    } while (lVar3 != 3);
  }
  pfVar2 = local_28;
  local_28[4] = 0.0;
  local_28[5] = 0.0;
  local_28[6] = 0.0;
  local_28[7] = 0.0;
  local_28[0] = 0.0;
  local_28[1] = 0.0;
  local_28[2] = 0.0;
  local_28[3] = 0.0;
  local_28[8] = 0.0;
  lVar3 = 0;
  lVar6 = 0;
  do {
    lVar7 = 0;
    auVar10 = _DAT_00a99400;
    do {
      bVar12 = SUB164(auVar10 ^ _DAT_00a99450,4) == -0x80000000 &&
               SUB164(auVar10 ^ _DAT_00a99450,0) < -0x7ffffffd;
      if (bVar12) {
        uVar13 = 0x3f800000;
        if (lVar3 != lVar7) {
          uVar13 = 0;
        }
        *(undefined4 *)((long)pfVar2 + lVar7) = uVar13;
      }
      if (bVar12) {
        uVar13 = 0x3f800000;
        if (lVar3 + -0xc != lVar7) {
          uVar13 = 0;
        }
        *(undefined4 *)((long)pfVar2 + lVar7 + 0xc) = uVar13;
      }
      lVar11 = auVar10._8_8_;
      auVar10._0_8_ = auVar10._0_8_ + 2;
      auVar10._8_8_ = lVar11 + 2;
      lVar7 = lVar7 + 0x18;
    } while (lVar7 != 0x30);
    lVar6 = lVar6 + 1;
    lVar3 = lVar3 + 0xc;
    pfVar2 = pfVar2 + 1;
  } while (lVar6 != 3);
  pfVar2 = local_28;
  puVar1 = &local_88;
  puVar5 = &uStack_58;
  lVar3 = 0;
  do {
    lVar6 = 0;
    do {
      *(float *)((long)pfVar2 + lVar6) =
           *(float *)((long)puVar5 + lVar6) * *(float *)((long)puVar1 + lVar6);
      lVar6 = lVar6 + 0xc;
    } while (lVar6 != 0x24);
    lVar3 = lVar3 + 1;
    pfVar2 = pfVar2 + 1;
    puVar1 = (undefined8 *)((long)puVar1 + 4);
    puVar5 = (undefined8 *)((long)puVar5 + 4);
  } while (lVar3 != 3);
  local_98 = local_98 & 0xffffffff00000000;
  local_a0[0] = 0.0;
  local_a0[1] = 0.0;
  lVar3 = 0;
  do {
    local_a0[lVar3] = local_28[lVar3] + local_28[lVar3 + 3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  afStack_b8[4] = 0.0;
  afStack_b8[2] = 0.0;
  afStack_b8[3] = 0.0;
  lVar3 = 0;
  do {
    afStack_b8[lVar3 + 2] = local_a0[lVar3] + local_28[lVar3 + 6];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_98 = 0x100000000;
  local_90 = 2;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[(int)local_a0[lVar3]] = afStack_b8[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(matrixCompMult(in0, in1));
	}